

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  u8 uVar1;
  sqlite3 *db;
  Table *pTVar2;
  void *p;
  ushort uVar3;
  Column *data;
  Expr *pEVar4;
  ExprList_item *pEVar5;
  HashElem *pHVar6;
  size_t sVar7;
  ulong uVar8;
  Column *pCVar9;
  Column **extraout_RAX;
  Column **ppCVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  u32 cnt;
  Hash ht;
  uint local_7c;
  Column *local_78;
  i16 *local_70;
  ulong local_68;
  ExprList_item *local_60;
  Column **local_58;
  ulong local_50;
  Hash local_48;
  
  db = pParse->db;
  local_48.htsize = 0;
  local_48.count = 0;
  local_48.first = (HashElem *)0x0;
  local_48.ht = (_ht *)0x0;
  uVar11 = 0;
  if (pEList == (ExprList *)0x0) {
    data = (Column *)0x0;
    uVar14 = 0;
  }
  else {
    uVar14 = (ulong)pEList->nExpr;
    data = (Column *)sqlite3DbMallocZero(db,uVar14 << 5);
  }
  *pnCol = (i16)uVar14;
  *paCol = data;
  local_58 = paCol;
  if (0 < (int)uVar14) {
    local_60 = pEList->a;
    local_50 = uVar14 & 0xffffffff;
    uVar12 = 0;
    local_78 = data;
    local_70 = pnCol;
    local_68 = uVar14;
    do {
      if (db->mallocFailed != '\0') goto LAB_0016459c;
      pcVar13 = local_60[uVar12].zName;
      if (pcVar13 == (char *)0x0) {
        pEVar4 = local_60[uVar12].pExpr;
        while ((pEVar4 != (Expr *)0x0 && ((pEVar4->flags >> 0xc & 1) != 0))) {
          if ((pEVar4->flags >> 0x12 & 1) == 0) {
            pEVar5 = (ExprList_item *)&pEVar4->pLeft;
          }
          else {
            pEVar5 = ((pEVar4->x).pList)->a;
          }
          pEVar4 = pEVar5->pExpr;
        }
        for (; uVar1 = pEVar4->op, uVar1 == 'z'; pEVar4 = pEVar4->pRight) {
        }
        if (uVar1 == '\x1b') {
          pCVar9 = (Column *)&pEVar4->u;
        }
        else if ((uVar1 == 0x98) && (pTVar2 = pEVar4->pTab, pTVar2 != (Table *)0x0)) {
          uVar3 = pEVar4->iColumn;
          if ((short)uVar3 < 0) {
            uVar3 = pTVar2->iPKey;
          }
          pcVar13 = "rowid";
          if ((short)uVar3 < 0) goto LAB_00164457;
          pCVar9 = pTVar2->aCol + uVar3;
        }
        else {
          pCVar9 = (Column *)&local_60[uVar12].zSpan;
        }
        pcVar13 = pCVar9->zName;
      }
LAB_00164457:
      if (pcVar13 == (char *)0x0) {
        pcVar13 = sqlite3MPrintf(db,"column%d",(ulong)((int)uVar12 + 1));
      }
      else {
        pcVar13 = sqlite3DbStrDup(db,pcVar13);
      }
      local_7c = 0;
      while (pcVar13 != (char *)0x0) {
        pHVar6 = findElementWithHash(&local_48,pcVar13,(uint *)0x0);
        if (pHVar6->data == (void *)0x0) {
          data->zName = pcVar13;
          pCVar9 = (Column *)sqlite3HashInsert(&local_48,pcVar13,data);
          uVar11 = (uint)local_68;
          if (((pCVar9 == data) && (db->mallocFailed == '\0')) && (db->bBenignMalloc == '\0')) {
            db->mallocFailed = '\x01';
            if (0 < db->nVdbeExec) {
              (db->u1).isInterrupted = 1;
            }
            (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
          }
          goto LAB_00164588;
        }
        sVar7 = strlen(pcVar13);
        if ((sVar7 & 0x3fffffff) == 0) {
          uVar14 = 0;
        }
        else {
          uVar8 = (ulong)((uint)sVar7 & 0x3fffffff);
          do {
            if ((long)uVar8 < 2) {
              uVar8 = 0;
              break;
            }
            lVar15 = uVar8 - 1;
            uVar8 = uVar8 - 1;
          } while (0xfffffffffffffff5 < (ulong)(byte)pcVar13[lVar15] - 0x3a);
          uVar14 = (ulong)((uint)sVar7 & 0x3fffffff);
          if (pcVar13[uVar8 & 0xffffffff] == ':') {
            uVar14 = uVar8 & 0xffffffff;
          }
        }
        local_7c = local_7c + 1;
        pcVar13 = sqlite3MPrintf(db,"%.*z:%u",uVar14,pcVar13);
        if (3 < local_7c) {
          sqlite3_randomness(4,&local_7c);
        }
      }
      data->zName = (char *)0x0;
      uVar11 = (uint)local_68;
LAB_00164588:
      uVar12 = uVar12 + 1;
      data = data + 1;
    } while (uVar12 != local_50);
    uVar12 = (ulong)uVar11;
LAB_0016459c:
    uVar11 = (uint)uVar12;
    pnCol = local_70;
    data = local_78;
  }
  sqlite3HashClear(&local_48);
  ppCVar10 = extraout_RAX;
  if (db->mallocFailed != '\0') {
    if (uVar11 != 0) {
      lVar15 = 0;
      do {
        p = *(void **)((long)&data->zName + lVar15);
        if (p != (void *)0x0) {
          sqlite3DbFreeNN(db,p);
        }
        lVar15 = lVar15 + 0x20;
      } while ((ulong)uVar11 << 5 != lVar15);
    }
    if (data != (Column *)0x0) {
      sqlite3DbFreeNN(db,data);
    }
    *local_58 = (Column *)0x0;
    *pnCol = 0;
    ppCVar10 = local_58;
  }
  return (int)ppCVar10;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    /* Get an appropriate name for the column
    */
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN && pColExpr->pTab!=0 ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        Table *pTab = pColExpr->pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        zName = pEList->a[i].zSpan;
      }
    }
    if( zName ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && sqlite3HashFind(&ht, zName)!=0 ){
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zName = zName;
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pCol)==pCol ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}